

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

SHADER_TYPE __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 StageIndex)

{
  Uint32 UVar1;
  Char *pCVar2;
  undefined1 local_78 [8];
  string msg_1;
  SHADER_TYPE StageBit;
  Uint32 Index;
  SHADER_TYPE Stages;
  undefined1 local_40 [8];
  string msg;
  Uint32 StageIndex_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = StageIndex;
  UVar1 = GetNumActiveShaderStages(this);
  if (UVar1 <= StageIndex) {
    FormatString<char[26],char[40]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StageIndex < GetNumActiveShaderStages()",(char (*) [40])(ulong)UVar1)
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetActiveShaderStageType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x297);
    std::__cxx11::string::~string((string *)local_40);
  }
  StageBit = this->m_ShaderStages;
  msg_1.field_2._12_4_ = 0;
  while( true ) {
    if (StageBit == SHADER_TYPE_UNKNOWN) {
      FormatString<char[22]>((string *)local_78,(char (*) [22])0xc0a2ba);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetActiveShaderStageType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x2a2);
      std::__cxx11::string::~string((string *)local_78);
      return SHADER_TYPE_UNKNOWN;
    }
    msg_1.field_2._8_4_ = ExtractLSB<Diligent::SHADER_TYPE>(&StageBit);
    if (msg_1.field_2._12_4_ == msg.field_2._12_4_) break;
    msg_1.field_2._12_4_ = msg_1.field_2._12_4_ + 1;
  }
  return msg_1.field_2._8_4_;
}

Assistant:

SHADER_TYPE GetActiveShaderStageType(Uint32 StageIndex) const
    {
        VERIFY_EXPR(StageIndex < GetNumActiveShaderStages());

        SHADER_TYPE Stages = m_ShaderStages;
        for (Uint32 Index = 0; Stages != SHADER_TYPE_UNKNOWN; ++Index)
        {
            SHADER_TYPE StageBit = ExtractLSB(Stages);

            if (Index == StageIndex)
                return StageBit;
        }

        UNEXPECTED("Index is out of range");
        return SHADER_TYPE_UNKNOWN;
    }